

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_addcaption_text(flvtag_t *tag,utf8_char_t *text)

{
  uint32_t uVar1;
  int iVar2;
  sei_t *local_1e80;
  int ret;
  caption_frame_t frame;
  sei_t sei;
  utf8_char_t *text_local;
  flvtag_t *tag_local;
  
  uVar1 = flvtag_pts(tag);
  sei_init((sei_t *)&frame.status,(double)uVar1);
  if (text == (utf8_char_t *)0x0) {
    sei_from_caption_clear((sei_t *)frame.front.cell[0][9]);
  }
  else {
    caption_frame_init((caption_frame_t *)0x105aff);
    caption_frame_from_text
              ((caption_frame_t *)frame.xds.content._20_8_,(utf8_char_t *)frame.xds.content._12_8_);
    sei_from_caption_frame
              ((sei_t *)frame.front.cell[0][0x1b],(caption_frame_t *)frame.front.cell[0][0x1a]);
  }
  iVar2 = flvtag_addsei(tag,(sei_t *)&frame.status);
  sei_free(local_1e80);
  return iVar2;
}

Assistant:

int flvtag_addcaption_text(flvtag_t* tag, const utf8_char_t* text)
{
    sei_t sei;
    sei_init(&sei, flvtag_pts(tag));

    if (text) {
        caption_frame_t frame;
        caption_frame_init(&frame);
        caption_frame_from_text(&frame, text);
        sei_from_caption_frame(&sei, &frame);
    } else {
        sei_from_caption_clear(&sei);
    }

    int ret = flvtag_addsei(tag, &sei);
    sei_free(&sei);
    return ret;
}